

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu511.c
# Opt level: O0

MPP_RET hal_jpege_vepu511_start(void *hal,HalEncTask *enc_task)

{
  long lVar1;
  long lVar2;
  long local_60;
  MppDevRegRdCfg cfg1;
  MppDevRegWrCfg cfg;
  JpegV511Status *reg_out;
  JpegV511RegSet *hw_regs;
  JpegeV511HalContext *ctx;
  MPP_RET ret;
  HalEncTask *enc_task_local;
  void *hal_local;
  
  lVar1 = *(long *)((long)hal + 0x70);
  lVar2 = *(long *)((long)hal + 0x78);
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_v511","(%d) enter\n","hal_jpege_vepu511_start",0x1e8);
  }
  if ((enc_task->flags).err == 0) {
    cfg1._8_8_ = lVar1;
    hal_local._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),4,&cfg1.size);
    if (hal_local._4_4_ == MPP_OK) {
      cfg1._8_8_ = lVar1 + 0x3c4;
      hal_local._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),4,&cfg1.size);
      if (hal_local._4_4_ == MPP_OK) {
        cfg1._8_8_ = lVar1 + 0x124;
        hal_local._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),4,&cfg1.size);
        if (hal_local._4_4_ == MPP_OK) {
          cfg1._8_8_ = lVar1 + 0x544;
          hal_local._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),4,&cfg1.size);
          if (hal_local._4_4_ == MPP_OK) {
            cfg1.reg._0_4_ = 4;
            cfg1.reg._4_4_ = 0x2c;
            local_60 = lVar2;
            hal_local._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),5,&local_60);
            if (hal_local._4_4_ == MPP_OK) {
              local_60 = lVar2 + 4;
              cfg1.reg._0_4_ = 0x250;
              cfg1.reg._4_4_ = 0x4000;
              hal_local._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),5,&local_60);
              if (hal_local._4_4_ == MPP_OK) {
                hal_local._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0xf,(void *)0x0);
                if (hal_local._4_4_ != MPP_OK) {
                  _mpp_log_l(2,"hal_jpege_v511","send cmd failed %d\n","hal_jpege_vepu511_start",
                             (ulong)(uint)hal_local._4_4_);
                }
                if ((hal_jpege_debug & 1) != 0) {
                  _mpp_log_l(4,"hal_jpege_v511","(%d) leave\n","hal_jpege_vepu511_start",0x230);
                }
              }
              else {
                _mpp_log_l(2,"hal_jpege_v511","set register read failed %d\n",
                           "hal_jpege_vepu511_start",(ulong)(uint)hal_local._4_4_);
              }
            }
            else {
              _mpp_log_l(2,"hal_jpege_v511","set register read failed %d\n",
                         "hal_jpege_vepu511_start",(ulong)(uint)hal_local._4_4_);
            }
          }
          else {
            _mpp_log_l(2,"hal_jpege_v511","set register write failed %d\n","hal_jpege_vepu511_start"
                       ,(ulong)(uint)hal_local._4_4_);
          }
        }
        else {
          _mpp_log_l(2,"hal_jpege_v511","set register write failed %d\n","hal_jpege_vepu511_start",
                     (ulong)(uint)hal_local._4_4_);
        }
      }
      else {
        _mpp_log_l(2,"hal_jpege_v511","set register write failed %d\n","hal_jpege_vepu511_start",
                   (ulong)(uint)hal_local._4_4_);
      }
    }
    else {
      _mpp_log_l(2,"hal_jpege_v511","set register write failed %d\n","hal_jpege_vepu511_start",
                 (ulong)(uint)hal_local._4_4_);
    }
  }
  else {
    _mpp_log_l(2,"hal_jpege_v511","enc_task->flags.err %08x, return e arly",
               "hal_jpege_vepu511_start",(ulong)(enc_task->flags).err);
    hal_local._4_4_ = MPP_NOK;
  }
  return hal_local._4_4_;
}

Assistant:

MPP_RET hal_jpege_vepu511_start(void *hal, HalEncTask *enc_task)
{
    MPP_RET ret = MPP_OK;
    JpegeV511HalContext *ctx = (JpegeV511HalContext *)hal;
    JpegV511RegSet *hw_regs = ctx->regs;
    JpegV511Status *reg_out = ctx->reg_out;
    MppDevRegWrCfg cfg;
    MppDevRegRdCfg cfg1;
    hal_jpege_enter();

    if (enc_task->flags.err) {
        mpp_err_f("enc_task->flags.err %08x, return e arly",
                  enc_task->flags.err);
        return MPP_NOK;
    }

    cfg.reg = (RK_U32*)&hw_regs->reg_ctl;
    cfg.size = sizeof(Vepu511ControlCfg);
    cfg.offset = VEPU511_CTL_OFFSET;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &cfg);
    if (ret) {
        mpp_err_f("set register write failed %d\n", ret);
        return ret;
    }

    cfg.reg = &hw_regs->jpeg_table;
    cfg.size = sizeof(JpegVepu511Tab);
    cfg.offset = VEPU511_JPEGTAB_OFFSET;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &cfg);
    if (ret) {
        mpp_err_f("set register write failed %d\n", ret);
        return ret;
    }

    cfg.reg = &hw_regs->reg_base;
    cfg.size = sizeof(JpegVepu511Base);
    cfg.offset = VEPU511_FRAME_OFFSET;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &cfg);
    if (ret) {
        mpp_err_f("set register write failed %d\n", ret);
        return ret;
    }

    cfg.reg = &hw_regs->reg_osd;
    cfg.size = sizeof(Vepu511OsdRegs);
    cfg.offset = VEPU511_OSD_OFFSET;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &cfg);
    if (ret) {
        mpp_err_f("set register write failed %d\n", ret);
        return ret;
    }

    cfg1.reg = &reg_out->hw_status;
    cfg1.size = sizeof(RK_U32);
    cfg1.offset = VEPU511_REG_BASE_HW_STATUS;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &cfg1);
    if (ret) {
        mpp_err_f("set register read failed %d\n", ret);
        return ret;
    }

    cfg1.reg = &reg_out->st;
    cfg1.size = sizeof(JpegV511Status) - 4;
    cfg1.offset = VEPU511_STATUS_OFFSET;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &cfg1);
    if (ret) {
        mpp_err_f("set register read failed %d\n", ret);
        return ret;
    }

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
    if (ret) {
        mpp_err_f("send cmd failed %d\n", ret);
    }
    hal_jpege_leave();
    return ret;
}